

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O0

void anon_unknown.dwarf_20552b::fill2
               (Array2D<unsigned_short> *a,Array2D<unsigned_short> *b,int nx,int ny,unsigned_short v
               )

{
  unsigned_short *puVar1;
  int in_ECX;
  int in_EDX;
  Array2D<unsigned_short> *in_RSI;
  Array2D<unsigned_short> *in_RDI;
  unsigned_short in_R8W;
  int x;
  int y;
  int local_24;
  int local_20;
  
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
      puVar1 = Imf_2_5::Array2D<unsigned_short>::operator[](in_RSI,(long)local_20);
      puVar1[local_24] = in_R8W;
      puVar1 = Imf_2_5::Array2D<unsigned_short>::operator[](in_RDI,(long)local_20);
      puVar1[local_24] = in_R8W;
    }
  }
  return;
}

Assistant:

void
fill2 (Array2D <unsigned short> &a,
       Array2D <unsigned short> &b,
       int nx,
       int ny,
       unsigned short v)
{
    for (int y = 0; y < ny; ++y)
	for (int x = 0; x < nx; ++x)
	    a[y][x] = b[y][x] = v;
}